

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ae086::____C_A_T_C_H____T_E_S_T____22::test(____C_A_T_C_H____T_E_S_T____22 *this)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  ExprLhs<const_unsigned_long_&> EVar1;
  ExprLhs<const_unsigned_long_&> *this_00;
  Entity EVar2;
  AssertionHandler catchAssertionHandler_1;
  int i;
  AssertionHandler catchAssertionHandler;
  EntityCreatedEventReceiver receiver;
  ITransientExpression *in_stack_fffffffffffffda8;
  EntityCreatedEventReceiver *in_stack_fffffffffffffdb0;
  EntityCreatedEventReceiver *this_01;
  Id in_stack_fffffffffffffdb8;
  AssertionHandler *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  SourceLineInfo *this_02;
  unsigned_long *rhs;
  ExprLhs<const_unsigned_long_&> *in_stack_fffffffffffffde8;
  undefined1 local_1b8 [104];
  Entity local_150;
  int local_13c;
  size_type local_138;
  undefined8 local_130;
  unsigned_long *local_120;
  EntityCreatedEventReceiver *in_stack_fffffffffffffef8;
  EventManager *in_stack_ffffffffffffff00;
  SourceLineInfo local_d8;
  StringRef local_c8;
  unsigned_long local_60 [8];
  vector<entityx::Entity,_std::allocator<entityx::Entity>_> local_20;
  
  rhs = local_60;
  test::EntityCreatedEventReceiver::EntityCreatedEventReceiver(in_stack_fffffffffffffdb0);
  entityx::EventManager::
  subscribe<entityx::EntityCreatedEvent,(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____22::test()::EntityCreatedEventReceiver>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_c8 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
  this_02 = &local_d8;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x135);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8.id_);
  capturedExpression.m_size = (size_type)this_02;
  capturedExpression.m_start = in_stack_fffffffffffffdc8;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffdc0,(StringRef *)in_stack_fffffffffffffdb8.id_,
             (SourceLineInfo *)in_stack_fffffffffffffdb0,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  local_130 = 0;
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)in_stack_fffffffffffffda8,(unsigned_long *)0x296077);
  local_120 = EVar1.m_lhs;
  local_138 = Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::size
                        (&local_20);
  Catch::ExprLhs<unsigned_long_const&>::operator==(in_stack_fffffffffffffde8,rhs);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x2960e3);
  Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffffdb0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffffdb0);
  EVar2.id_.id_ = in_stack_fffffffffffffdb8.id_;
  EVar2.manager_ = (EntityManager *)in_stack_fffffffffffffdc0;
  for (local_13c = 0; local_13c < 10; local_13c = local_13c + 1) {
    EVar2 = entityx::EntityManager::create(EVar2.manager_);
    local_150 = EVar2;
  }
  local_1b8._16_16_ =
       (undefined1  [16])
       operator____catch_sr((char *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
  this_01 = (EntityCreatedEventReceiver *)local_1b8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
             ,0x139);
  Catch::StringRef::StringRef((StringRef *)EVar2.manager_,(char *)EVar2.id_.id_.id_);
  capturedExpression_00.m_size = (size_type)this_02;
  capturedExpression_00.m_start = (char *)EVar1.m_lhs;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)EVar2.manager_,(StringRef *)EVar2.id_.id_.id_,
             (SourceLineInfo *)this_01,capturedExpression_00,
             (Flags)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  EVar1 = Catch::Decomposer::operator<=
                    ((Decomposer *)in_stack_fffffffffffffda8,(unsigned_long *)0x2962bc);
  this_00 = (ExprLhs<const_unsigned_long_&> *)
            Catch::clara::std::vector<entityx::Entity,_std::allocator<entityx::Entity>_>::size
                      (&local_20);
  Catch::ExprLhs<unsigned_long_const&>::operator==(this_00,rhs);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)this_01,(ITransientExpression *)EVar1.m_lhs);
  Catch::BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&>::~BinaryExpr
            ((BinaryExpr<const_unsigned_long_&,_const_unsigned_long_&> *)0x296311);
  Catch::AssertionHandler::complete((AssertionHandler *)this_01);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this_01);
  test::EntityCreatedEventReceiver::~EntityCreatedEventReceiver(this_01);
  return;
}

Assistant:

void receive(const EntityCreatedEvent &event) {
      created.push_back(event.entity);
    }